

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one.hpp
# Opt level: O1

bool tao::pegtl::internal::contains<char>(char c,initializer_list<char> *l)

{
  char *pcVar1;
  
  pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (l->_M_array,l->_M_array + l->_M_len);
  return pcVar1 != l->_M_array + l->_M_len;
}

Assistant:

bool contains( const Char c, const std::initializer_list< Char >& l ) noexcept
         {
            return std::find( l.begin(), l.end(), c ) != l.end();
         }